

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O0

void __thiscall index_tree::build_index(index_tree *this,wstring *word)

{
  long lVar1;
  ulong uVar2;
  index_tree *in_RDI;
  size_t i;
  wstring *in_stack_00000088;
  index *in_stack_00000090;
  undefined8 in_stack_ffffffffffffffd8;
  ulong uVar3;
  ulong local_18;
  
  set_current_index(in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  lVar1 = std::__cxx11::wstring::size();
  if (lVar1 == 1) {
    std::__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x119600);
    index::build_index(in_stack_00000090,in_stack_00000088);
  }
  else {
    local_18 = 1;
    while (uVar3 = local_18, uVar2 = std::__cxx11::wstring::size(), uVar3 < uVar2) {
      std::__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<index,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x119645);
      index::build_index(in_stack_00000090,in_stack_00000088);
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void index_tree::build_index(const std::wstring& word)
{
    // 将当前索引设置为一级索引
    set_current_index(1);

    if (word.size() == 1)
    {
        current_index_->build_index(word);
    }
    else
    {
        for (std::size_t i = 1; i < word.size(); ++i)
        {
            current_index_->build_index(word);
        }
    }
}